

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O3

void __thiscall enact::ReferenceExpr::~ReferenceExpr(ReferenceExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Expr *pEVar3;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_00127600;
  if ((this->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    (this->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    pcVar2 = (this->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p;
    paVar1 = &(this->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
              super__Optional_payload<enact::Token,_true,_false,_false>.
              super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  if ((this->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    (this->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    pcVar2 = (this->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme._M_dataplus._M_p;
    paVar1 = &(this->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
              super__Optional_payload<enact::Token,_true,_false,_false>.
              super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->oper).lexeme._M_dataplus._M_p;
  paVar1 = &(this->oper).lexeme.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pEVar3 = (this->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  if (pEVar3 != (Expr *)0x0) {
    (*pEVar3->_vptr_Expr[1])();
  }
  (this->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  return;
}

Assistant:

~ReferenceExpr() override = default;